

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O0

void __thiscall
event_track::ingest_event_stream::write_to_dash_event_stream
          (ingest_event_stream *this,string *out_file)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  pointer ppVar4;
  pointer ppVar5;
  uchar *puVar6;
  size_type sVar7;
  ostream *poVar8;
  string local_2b0;
  string local_290;
  _Self local_270;
  _Self local_268;
  iterator it2;
  _Self local_258;
  iterator it;
  string local_248 [8];
  string scheme_id_uri;
  uint32_t time_scale;
  ostream local_218 [8];
  ofstream ot;
  string *out_file_local;
  ingest_event_stream *this_local;
  
  std::ofstream::ofstream(local_218,(string *)out_file,_S_out);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) != 0) {
    scheme_id_uri.field_2._8_4_ = fmp4_stream::init_fragment::get_time_scale((init_fragment *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248,"",(allocator *)((long)&it._M_node + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 7));
    local_258._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>_>_>_>
         ::begin(&this->events_list_);
    while( true ) {
      it2._M_node = (_Base_ptr)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>_>_>_>
                    ::end(&this->events_list_);
      bVar2 = std::operator!=(&local_258,(_Self *)&it2);
      if (!bVar2) break;
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>_>_>
               ::operator->(&local_258);
      std::__cxx11::string::operator=(local_248,(string *)ppVar4);
      poVar8 = std::operator<<(local_218,"<EventStream ");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      iVar3 = std::__cxx11::string::compare((char *)local_248);
      if (iVar3 == 0) {
        poVar8 = std::operator<<(local_218,"schemeIdUri=");
        poVar8 = std::operator<<(poVar8,'\"');
        poVar8 = std::operator<<(poVar8,"urn:scte:scte35:2014:xml+bin");
        poVar8 = std::operator<<(poVar8,'\"');
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar8 = std::operator<<(local_218,"schemeIdUri=");
        poVar8 = std::operator<<(poVar8,'\"');
        poVar8 = std::operator<<(poVar8,local_248);
        poVar8 = std::operator<<(poVar8,'\"');
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      }
      poVar8 = std::operator<<(local_218," timescale=");
      poVar8 = std::operator<<(poVar8,'\"');
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,scheme_id_uri.field_2._8_4_);
      poVar8 = std::operator<<(poVar8,'\"');
      poVar8 = std::operator<<(poVar8,">");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>_>_>
               ::operator->(&local_258);
      local_268._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>
           ::begin(&ppVar4->second);
      while( true ) {
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>_>_>
                 ::operator->(&local_258);
        local_270._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>
             ::end(&ppVar4->second);
        bVar2 = std::operator!=(&local_268,&local_270);
        if (!bVar2) break;
        poVar8 = std::operator<<((ostream *)&std::cout," writing an event to output ");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        poVar8 = std::operator<<(local_218,"<Event ");
        poVar8 = std::operator<<(poVar8,"presentationTime=");
        poVar8 = std::operator<<(poVar8,'\"');
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>
                 ::operator->(&local_268);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,(ppVar5->second).presentation_time_);
        poVar8 = std::operator<<(poVar8,'\"');
        poVar8 = std::operator<<(poVar8," ");
        poVar8 = std::operator<<(poVar8,"duration=");
        poVar8 = std::operator<<(poVar8,'\"');
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>
                 ::operator->(&local_268);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,(ppVar5->second).event_duration_);
        poVar8 = std::operator<<(poVar8,'\"');
        poVar8 = std::operator<<(poVar8," ");
        poVar8 = std::operator<<(poVar8,"id=");
        poVar8 = std::operator<<(poVar8,'\"');
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>
                 ::operator->(&local_268);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,(ppVar5->second).id_);
        std::operator<<(poVar8,'\"');
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>
                 ::operator->(&local_268);
        iVar3 = std::__cxx11::string::compare((char *)&(ppVar5->second).scheme_id_uri_);
        if (iVar3 == 0) {
          poVar8 = std::operator<<(local_218,'>');
          poVar8 = (ostream *)
                   std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          poVar8 = std::operator<<(poVar8,"  <Signal xmlns=");
          poVar8 = std::operator<<(poVar8,'\"');
          poVar8 = std::operator<<(poVar8,"http://www.scte.org/schemas/35/2016");
          poVar8 = std::operator<<(poVar8,'\"');
          poVar8 = std::operator<<(poVar8,'>');
          poVar8 = (ostream *)
                   std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          poVar8 = std::operator<<(poVar8,"    <Binary>");
          ppVar5 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>
                   ::operator->(&local_268);
          puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             (&(ppVar5->second).message_data_);
          ppVar5 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>
                   ::operator->(&local_268);
          sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            (&(ppVar5->second).message_data_);
          base64_encode_abi_cxx11_(&local_290,puVar6,sVar7 & 0xffffffff);
          poVar8 = std::operator<<(poVar8,(string *)&local_290);
          poVar8 = std::operator<<(poVar8,"</Binary>");
          poVar8 = (ostream *)
                   std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          poVar8 = std::operator<<(poVar8,"  </Signal>");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_290);
        }
        else {
          poVar8 = std::operator<<(local_218," ");
          poVar8 = std::operator<<(poVar8,"contentEncoding=");
          poVar8 = std::operator<<(poVar8,'\"');
          poVar8 = std::operator<<(poVar8,"base64");
          poVar8 = std::operator<<(poVar8,'\"');
          poVar8 = std::operator<<(poVar8,'>');
          poVar8 = (ostream *)
                   std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          ppVar5 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>
                   ::operator->(&local_268);
          puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             (&(ppVar5->second).message_data_);
          ppVar5 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>
                   ::operator->(&local_268);
          sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            (&(ppVar5->second).message_data_);
          base64_encode_abi_cxx11_(&local_2b0,puVar6,sVar7 & 0xffffffff);
          poVar8 = std::operator<<(poVar8,(string *)&local_2b0);
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_2b0);
        }
        poVar8 = std::operator<<(local_218,"</Event>");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        std::_Rb_tree_iterator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>::
        operator++(&local_268,0);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>_>_>
      ::operator++(&local_258);
    }
    poVar8 = std::operator<<(local_218,"</EventStream> ");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_248);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void event_track::ingest_event_stream::write_to_dash_event_stream(std::string &out_file)
{
	std::ofstream ot(out_file);

	if (ot.good()) {

		uint32_t time_scale = init_fragment_.get_time_scale();
		std::string scheme_id_uri = "";

		for (auto it = this->events_list_.begin(); it != this->events_list_.end(); ++it)
		{
			scheme_id_uri = it->first;
			ot << "<EventStream " << std::endl;
			if (scheme_id_uri.compare("urn:scte:scte35:2013:bin") == 0) // convert binary scte 214 to xml + bin
			{
				ot << "schemeIdUri=" << '"' << "urn:scte:scte35:2014:xml+bin" << '"' << std::endl;
			}
			else {
				ot << "schemeIdUri=" << '"' << scheme_id_uri << '"' << std::endl;
			}
			ot << " timescale=" << '"' << time_scale << '"' << ">" << std::endl;

			// write each of the event messages as moof mdat combinations in sparse track 
			for (auto it2 = it->second.begin(); it2 != it->second.end(); it2++)
			{
				std::cout << " writing an event to output " << std::endl;
				ot << "<Event "
					<< "presentationTime=" << '"' << it2->second.presentation_time_ << '"' << " "  \
					<< "duration=" << '"' << it2->second.event_duration_<< '"' << " "  \
					<< "id=" << '"' << it2->second.id_ << '"';
				if (it2->second.scheme_id_uri_.compare("urn:scte:scte35:2013:bin") == 0) // write binary scte as xml + bin as defined by scte-35
				{
					ot << '>' << std::endl << "  <Signal xmlns=" << '"' << "http://www.scte.org/schemas/35/2016" << '"' << '>' << std::endl \
						<< "    <Binary>" << base64_encode(it2->second.message_data_.data(), (unsigned int) it2->second.message_data_.size()) << "</Binary>" << std::endl
						<< "  </Signal>" << std::endl;
				}
				else {
					ot << " " << "contentEncoding=" << '"' << "base64" << '"' << '>' << std::endl
						<< base64_encode(it2->second.message_data_.data(), (unsigned int)it2->second.message_data_.size()) << std::endl;
				}
				ot << "</Event>" << std::endl;
			}
			}
			ot << "</EventStream> " << std::endl;
		}

	    ot.close();
	}